

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int sexp_bignum_zerop(sexp a)

{
  uint uVar1;
  
  uVar1 = (a->value).promise.donep;
  do {
    uVar1 = uVar1 - 1;
    if ((int)uVar1 < 0) {
      return 1;
    }
  } while (*(long *)((long)&a->value + (ulong)(uVar1 & 0x7fffffff) * 8 + 0x10) == 0);
  return 0;
}

Assistant:

int sexp_bignum_zerop (sexp a) {
  int i;
  sexp_uint_t *data = sexp_bignum_data(a);
  for (i=sexp_bignum_length(a)-1; i>=0; i--)
    if (data[i])
      return 0;
  return 1;
}